

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlockMap.cpp
# Opt level: O1

void __thiscall
Memory::HeapBlockMap32::Cleanup(HeapBlockMap32 *this,bool concurrentFindImplicitRoot)

{
  undefined4 *puVar1;
  L2MapChunk *this_00;
  code *pcVar2;
  ulong uVar3;
  bool bVar4;
  HeapAllocator *this_01;
  ulong uVar5;
  long lVar6;
  undefined8 *in_FS_OFFSET;
  
  puVar1 = (undefined4 *)*in_FS_OFFSET;
  lVar6 = 0;
  do {
    this_00 = this->map[lVar6];
    if ((this_00 != (L2MapChunk *)0x0) && (this_00->map[0] == (HeapBlock *)0x0)) {
      uVar3 = 0;
      do {
        uVar5 = uVar3;
        if (uVar5 == 0xff) break;
        uVar3 = uVar5 + 1;
      } while (this_00->map[uVar5 + 1] == (HeapBlock *)0x0);
      if (0xfe < uVar5) {
        this->map[lVar6] = (L2MapChunk *)0x0;
        this_01 = HeapAllocator::GetNoMemProtectInstance();
        L2MapChunk::~L2MapChunk(this_00);
        HeapAllocator::Free(this_01,this_00,0x2c08);
        if (this->count == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar1 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                             ,0x49b,"(count > 0)","count > 0");
          if (!bVar4) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar1 = 0;
        }
        this->count = this->count - 1;
      }
    }
    lVar6 = lVar6 + 1;
    if (lVar6 == 0x1000) {
      return;
    }
  } while( true );
}

Assistant:

void
HeapBlockMap32::Cleanup(bool concurrentFindImplicitRoot)
{
    for (uint id1 = 0; id1 < L1Count; id1++)
    {
        L2MapChunk * l2map = map[id1];
        if (l2map != nullptr && l2map->IsEmpty())
        {
            // Concurrent searches for implicit roots will never see empty L2 maps.
            map[id1] = nullptr;
            NoMemProtectHeapDelete(l2map);
            Assert(count > 0);
            count--;
        }
    }
}